

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char8_t * fmt::v5::internal::
          format_decimal<fmt::v5::char8_t,unsigned_long,fmt::v5::char8_t*,fmt::v5::internal::add_thousands_sep<fmt::v5::char8_t>>
                    (char8_t *out,unsigned_long value,int num_digits,
                    add_thousands_sep<fmt::v5::char8_t> sep)

{
  add_thousands_sep<fmt::v5::char8_t> thousands_sep;
  type pcVar1;
  char8_t *in_stack_00000008;
  char8_t *in_stack_00000010;
  undefined8 in_stack_00000018;
  char8_t *end;
  char_type buffer [26];
  unsigned_long in_stack_ffffffffffffffa0;
  char8_t *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8 [16];
  
  thousands_sep._8_16_ = in_stack_ffffffffffffffc8;
  thousands_sep.sep_.data_ = in_stack_ffffffffffffffc0;
  format_decimal<unsigned_long,fmt::v5::char8_t,fmt::v5::internal::add_thousands_sep<fmt::v5::char8_t>>
            (in_stack_00000008,in_stack_ffffffffffffffa0,(int)((ulong)in_stack_00000018 >> 0x20),
             thousands_sep);
  pcVar1 = copy_str<fmt::v5::char8_t,fmt::v5::char8_t*,fmt::v5::char8_t*>
                     (in_stack_00000010,in_stack_00000008,(char8_t *)0x2e4cce);
  return pcVar1;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}